

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void parse_decode_block(AV1Decoder *pbi,ThreadData *td,int mi_row,int mi_col,aom_reader *r,
                       PARTITION_TYPE partition,BLOCK_SIZE bsize)

{
  byte bVar1;
  TX_SIZE TVar2;
  int16_t iVar3;
  int iVar4;
  int iVar5;
  uint blk_row;
  uint uVar6;
  uint uVar7;
  AV1_COMMON *cm_00;
  aom_reader *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  BLOCK_SIZE in_stack_00000008;
  int ac_delta_q;
  int dc_delta_q;
  int j;
  CommonQuantParams *quant_params;
  int current_qindex;
  int i;
  int idx;
  int idy;
  int height;
  int width;
  int bw;
  int bh;
  TX_SIZE max_tx_size;
  ThreadData *in_stack_00000060;
  int inter_block_tx;
  MB_MODE_INFO *mbmi;
  int num_planes;
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  DecoderCodingBlock *dcb;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 uVar8;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  TX_MODE tx_mode;
  uint in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  BLOCK_SIZE bsize_00;
  undefined2 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  undefined1 uVar9;
  int in_stack_ffffffffffffff74;
  int local_84;
  int local_74;
  int local_70;
  undefined4 in_stack_ffffffffffffff94;
  int iVar10;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int iVar11;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  int blk_col;
  undefined4 in_stack_ffffffffffffffac;
  AV1Decoder *in_stack_ffffffffffffffb0;
  MB_MODE_INFO *mbmi_00;
  undefined4 in_stack_ffffffffffffffb8;
  BLOCK_SIZE in_stack_ffffffffffffffc0;
  AV1_COMMON *pAVar12;
  aom_reader *r_00;
  
  uVar8 = CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(uint)in_stack_00000008);
  r_00 = in_RSI;
  decode_mbmi_block(in_stack_ffffffffffffffb0,
                    (DecoderCodingBlock *)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                    (aom_reader *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (PARTITION_TYPE)((uint)in_stack_ffffffffffffff94 >> 0x18),
                    in_stack_ffffffffffffffc0);
  av1_visit_palette((AV1Decoder *)
                    CONCAT44(in_stack_ffffffffffffff74,
                             CONCAT13(in_stack_ffffffffffffff73,
                                      CONCAT12(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70))
                            ),
                    (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    (aom_reader *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (palette_visitor_fn_t)
                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  tx_mode = (TX_MODE)((uint)in_stack_ffffffffffffff64 >> 0x18);
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3b60);
  iVar4 = av1_num_planes(cm_00);
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)&in_RSI[0x7a].allow_update_cdf;
  iVar5 = is_inter_block((MB_MODE_INFO *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  uVar9 = true;
  if (iVar5 == 0) {
    iVar5 = is_intrabc_block(mbmi_00);
    uVar9 = iVar5 != 0;
  }
  blk_row = (uint)(byte)uVar9;
  if (((((cm_00->features).tx_mode == '\x02') &&
       (iVar5 = block_signals_txsize(in_stack_00000008), iVar5 != 0)) &&
      (mbmi_00->skip_txfm == '\0')) &&
     ((blk_row != 0 &&
      (*(int *)((long)&in_RSI[0xa7].buffer +
               (ulong)((byte)*(undefined2 *)&mbmi_00->field_0xa7 & 7) * 4 + 4) == 0)))) {
    bVar1 = ""[in_stack_00000008];
    blk_col = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa8);
    iVar5 = tx_size_high_unit[bVar1];
    iVar11 = tx_size_wide_unit[bVar1];
    uVar6 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [in_stack_00000008];
    uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [in_stack_00000008];
    for (iVar10 = 0; iVar10 < (int)uVar7; iVar10 = iVar5 + iVar10) {
      for (local_70 = 0; local_70 < (int)uVar6; local_70 = iVar11 + local_70) {
        uVar8 = in_R8;
        read_tx_size_vartx((MACROBLOCKD *)cm_00,
                           (MB_MODE_INFO *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),
                           (TX_SIZE)((ulong)mbmi_00 >> 0x38),(int)mbmi_00,blk_row,blk_col,r_00);
      }
    }
  }
  else {
    TVar2 = read_tx_size((MACROBLOCKD *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),tx_mode,
                         in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                         (aom_reader *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                        );
    mbmi_00->tx_size = TVar2;
    if (blk_row != 0) {
      memset(mbmi_00->inter_tx_size,(uint)mbmi_00->tx_size,0x10);
    }
    TVar2 = mbmi_00->tx_size;
    in_stack_ffffffffffffff68 = (uint)(byte)in_RSI[0x81].ec.rng;
    in_stack_ffffffffffffff6c = 0;
    in_stack_ffffffffffffff72 = false;
    if (mbmi_00->skip_txfm != '\0') {
      iVar5 = is_inter_block((MB_MODE_INFO *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      in_stack_ffffffffffffff72 = iVar5 != 0;
    }
    set_txfm_ctxs(TVar2,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                  in_stack_ffffffffffffff58,
                  (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  bsize_00 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff6c >> 0x18);
  if ((cm_00->delta_q_info).delta_q_present_flag != 0) {
    for (local_74 = 0; bsize_00 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff6c >> 0x18),
        local_74 < 8; local_74 = local_74 + 1) {
      av1_get_qindex((segmentation *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      pAVar12 = cm_00;
      for (local_84 = 0; local_84 < iVar4; local_84 = local_84 + 1) {
        if (local_84 != 0) {
          if (local_84 == 1) {
            in_stack_ffffffffffffff5c = (cm_00->quant_params).u_dc_delta_q;
          }
          else {
            in_stack_ffffffffffffff5c = (cm_00->quant_params).v_dc_delta_q;
          }
        }
        if (local_84 == 0) {
          in_stack_ffffffffffffff58 = 0;
        }
        else if (local_84 == 1) {
          in_stack_ffffffffffffff54 = (cm_00->quant_params).u_ac_delta_q;
          in_stack_ffffffffffffff58 = in_stack_ffffffffffffff54;
        }
        else {
          in_stack_ffffffffffffff54 = (cm_00->quant_params).v_ac_delta_q;
          in_stack_ffffffffffffff58 = in_stack_ffffffffffffff54;
        }
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff58;
        iVar3 = av1_dc_quant_QTX(in_stack_ffffffffffffff50,(int)((ulong)uVar8 >> 0x20),
                                 (aom_bit_depth_t)uVar8);
        *(int16_t *)((long)in_RSI + (long)local_74 * 4 + (long)local_84 * 0xa30 + 0x90) = iVar3;
        iVar3 = av1_ac_quant_QTX(in_stack_ffffffffffffff50,(int)((ulong)uVar8 >> 0x20),
                                 (aom_bit_depth_t)uVar8);
        *(int16_t *)((long)in_RSI + (long)local_74 * 4 + (long)local_84 * 0xa30 + 0x92) = iVar3;
      }
      cm_00 = pAVar12;
    }
  }
  if (mbmi_00->skip_txfm != '\0') {
    av1_reset_entropy_context
              ((MACROBLOCKD *)
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT13(uVar9,CONCAT12(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)
                                )),bsize_00,in_stack_ffffffffffffff68);
  }
  decode_token_recon_block((AV1Decoder *)mbmi,in_stack_00000060,_bw,width._3_1_);
  return;
}

Assistant:

static inline void parse_decode_block(AV1Decoder *const pbi,
                                      ThreadData *const td, int mi_row,
                                      int mi_col, aom_reader *r,
                                      PARTITION_TYPE partition,
                                      BLOCK_SIZE bsize) {
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  decode_mbmi_block(pbi, dcb, mi_row, mi_col, r, partition, bsize);

  av1_visit_palette(pbi, xd, r, av1_decode_palette_tokens);

  AV1_COMMON *cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];
  int inter_block_tx = is_inter_block(mbmi) || is_intrabc_block(mbmi);
  if (cm->features.tx_mode == TX_MODE_SELECT && block_signals_txsize(bsize) &&
      !mbmi->skip_txfm && inter_block_tx && !xd->lossless[mbmi->segment_id]) {
    const TX_SIZE max_tx_size = max_txsize_rect_lookup[bsize];
    const int bh = tx_size_high_unit[max_tx_size];
    const int bw = tx_size_wide_unit[max_tx_size];
    const int width = mi_size_wide[bsize];
    const int height = mi_size_high[bsize];

    for (int idy = 0; idy < height; idy += bh)
      for (int idx = 0; idx < width; idx += bw)
        read_tx_size_vartx(xd, mbmi, max_tx_size, 0, idy, idx, r);
  } else {
    mbmi->tx_size = read_tx_size(xd, cm->features.tx_mode, inter_block_tx,
                                 !mbmi->skip_txfm, r);
    if (inter_block_tx)
      memset(mbmi->inter_tx_size, mbmi->tx_size, sizeof(mbmi->inter_tx_size));
    set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height,
                  mbmi->skip_txfm && is_inter_block(mbmi), xd);
  }

  if (cm->delta_q_info.delta_q_present_flag) {
    for (int i = 0; i < MAX_SEGMENTS; i++) {
      const int current_qindex =
          av1_get_qindex(&cm->seg, i, xd->current_base_qindex);
      const CommonQuantParams *const quant_params = &cm->quant_params;
      for (int j = 0; j < num_planes; ++j) {
        const int dc_delta_q = j == 0 ? quant_params->y_dc_delta_q
                                      : (j == 1 ? quant_params->u_dc_delta_q
                                                : quant_params->v_dc_delta_q);
        const int ac_delta_q = j == 0 ? 0
                                      : (j == 1 ? quant_params->u_ac_delta_q
                                                : quant_params->v_ac_delta_q);
        xd->plane[j].seg_dequant_QTX[i][0] = av1_dc_quant_QTX(
            current_qindex, dc_delta_q, cm->seq_params->bit_depth);
        xd->plane[j].seg_dequant_QTX[i][1] = av1_ac_quant_QTX(
            current_qindex, ac_delta_q, cm->seq_params->bit_depth);
      }
    }
  }
  if (mbmi->skip_txfm) av1_reset_entropy_context(xd, bsize, num_planes);

  decode_token_recon_block(pbi, td, r, bsize);
}